

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

double __thiscall ddd::DictionaryMLT<false,_true>::ratio_singles(DictionaryMLT<false,_false> *this)

{
  bool bVar1;
  uint32_t uVar2;
  const_iterator this_00;
  DaTrie<false,_true,_true> *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  *subtrie;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  *__range2;
  size_t num_nodes;
  size_t num_singles;
  vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  DaTrie<false,_true,_true> *in_stack_ffffffffffffffd0;
  __normal_iterator<const_std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_*,_std::vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>_>
  local_28;
  pointer *local_20;
  ulong local_18;
  ulong local_10;
  
  std::
  unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x171a2c);
  uVar2 = DaTrie<false,_true,_true>::num_singles(in_stack_ffffffffffffffd0);
  local_10 = (ulong)uVar2;
  std::
  unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x171a49);
  uVar2 = DaTrie<false,_true,_true>::num_nodes(in_RDI);
  local_18 = (ulong)uVar2;
  local_20 = &(in_RDI->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_28._M_current =
       (unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
        *)std::
          vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
          ::begin(in_stack_ffffffffffffffb8);
  this_00 = std::
            vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
            ::end(in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_*,_std::vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_*,_std::vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_*,_std::vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>_>
    ::operator*(&local_28);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                        *)0x171ab4);
    if (bVar1) {
      std::
      unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                    *)0x171ac4);
      uVar2 = DaTrie<false,_true,_false>::num_singles
                        ((DaTrie<false,_true,_false> *)this_00._M_current);
      local_10 = uVar2 + local_10;
      std::
      unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                    *)0x171ae2);
      uVar2 = DaTrie<false,_true,_false>::num_nodes((DaTrie<false,_true,_false> *)in_RDI);
      local_18 = uVar2 + local_18;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_*,_std::vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>_>
    ::operator++(&local_28);
  }
  auVar3._8_4_ = (int)(local_10 >> 0x20);
  auVar3._0_8_ = local_10;
  auVar3._12_4_ = 0x45300000;
  auVar4._8_4_ = (int)(local_18 >> 0x20);
  auVar4._0_8_ = local_18;
  auVar4._12_4_ = 0x45300000;
  return ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) /
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0));
}

Assistant:

double ratio_singles() const { // not in constant time
    size_t num_singles = prefix_subtrie_->num_singles();
    size_t num_nodes = prefix_subtrie_->num_nodes();
    for (auto &subtrie : suffix_subtries_) {
      if (!subtrie) {
        continue;
      }
      num_singles += subtrie->num_singles();
      num_nodes += subtrie->num_nodes();
    }
    return static_cast<double>(num_singles) / num_nodes;
  }